

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O1

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_accept_op_base<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>,_std::experimental::net::v1::ip::tcp>
       ::do_perform(reactor_op *base)

{
  int __fd;
  sockaddr *__addr;
  undefined4 uVar1;
  int iVar2;
  undefined8 in_RAX;
  int *piVar3;
  error_category *peVar4;
  error_category *peVar5;
  socklen_t *__addr_len;
  int iVar6;
  status sVar7;
  size_t *psVar8;
  undefined8 uStack_38;
  
  __fd = *(int *)&base[1].super_operation.next_;
  uStack_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_38._0_4_ = CONCAT13(*(undefined1 *)((long)&base[1].super_operation.next_ + 4),(int3)in_RAX)
  ;
  __addr = (sockaddr *)base[1].ec_._M_cat;
  psVar8 = &base[1].bytes_transferred_;
  if (__addr == (sockaddr *)0x0) {
    psVar8 = (size_t *)0x0;
  }
  do {
    if (__fd == -1) {
      iVar2 = -1;
      iVar6 = 9;
      peVar4 = (error_category *)::std::_V2::system_category();
LAB_00117ffd:
      (base->ec_)._M_value = iVar6;
      (base->ec_)._M_cat = peVar4;
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0;
      if (__addr == (sockaddr *)0x0) {
        __addr_len = (socklen_t *)0x0;
        uVar1 = 0;
      }
      else {
        uVar1 = (undefined4)*psVar8;
        __addr_len = (socklen_t *)((long)&uStack_38 + 4);
      }
      uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38);
      iVar2 = accept(__fd,__addr,__addr_len);
      if (__addr != (sockaddr *)0x0) {
        *psVar8 = uStack_38 >> 0x20;
      }
      iVar6 = *piVar3;
      peVar4 = (error_category *)::std::_V2::system_category();
      (base->ec_)._M_value = iVar6;
      (base->ec_)._M_cat = peVar4;
      if (iVar2 != -1) {
        iVar6 = 0;
        goto LAB_00117ffd;
      }
    }
    sVar7 = done;
    if (iVar2 != -1) goto LAB_00118040;
    peVar5 = (error_category *)::std::_V2::system_category();
    peVar4 = (base->ec_)._M_cat;
    iVar6 = (base->ec_)._M_value;
  } while ((peVar4 == peVar5) && (iVar6 == 4));
  if (peVar4 != peVar5 || iVar6 != 0xb) {
    if (iVar6 == 0x67 && peVar4 == peVar5) {
      if ((uStack_38 & 0x4000000) != 0) goto LAB_00118040;
    }
    else if ((uStack_38 & 0x4000000) != 0 || iVar6 != 0x47) goto LAB_00118040;
  }
  sVar7 = not_done;
LAB_00118040:
  socket_holder::reset((socket_holder *)&base[1].super_operation.func_);
  *(int *)&base[1].super_operation.func_ = iVar2;
  return sVar7;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_accept_op_base* o(
        static_cast<reactive_socket_accept_op_base*>(base));

    socket_type new_socket = invalid_socket;
    status result = socket_ops::non_blocking_accept(o->socket_,
        o->state_, o->peer_endpoint_ ? o->peer_endpoint_->data() : 0,
        o->peer_endpoint_ ? &o->addrlen_ : 0, o->ec_, new_socket)
    ? done : not_done;
    o->new_socket_.reset(new_socket);

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_accept", o->ec_));

    return result;
  }